

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merlin.cpp
# Opt level: O1

bool __thiscall Merlin::read_evidence(Merlin *this,string *evidence)

{
  mapped_type mVar1;
  istream *piVar2;
  mapped_type *pmVar3;
  runtime_error *this_00;
  int iVar4;
  int num_evid;
  size_t val;
  string err_msg;
  istringstream in;
  int local_1dc;
  mapped_type local_1d8;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  ulong local_1b0 [4];
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)evidence,_S_in);
  if ((abStack_190[*(long *)(local_1b0[0] - 0x18)] & 5) == 0) {
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::clear(&(this->m_evidence)._M_t);
    std::istream::operator>>(local_1b0,&local_1dc);
    if (0 < local_1dc) {
      iVar4 = 0;
      do {
        piVar2 = std::istream::_M_extract<unsigned_long>(local_1b0);
        std::istream::_M_extract<unsigned_long>((ulong *)piVar2);
        mVar1 = local_1d8;
        pmVar3 = std::
                 map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::operator[](&this->m_evidence,(key_type *)local_1d0);
        *pmVar3 = mVar1;
        iVar4 = iVar4 + 1;
      } while (iVar4 < local_1dc);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
    std::ios_base::~ios_base(local_138);
    return true;
  }
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d0,"Cannot open the evidence string","");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)local_1d0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Merlin::read_evidence(std::string evidence) {
	try {

		// Open the evidence file
		std::istringstream in(evidence);
		if (in.fail()) {
			std::string err_msg("Cannot open the evidence string");
			throw std::runtime_error(err_msg);
		}

		// Clear any previous evidence
		m_evidence.clear();

		// Read the evidence file
		int num_evid;
		in >> num_evid;
		for (int i = 0; i < num_evid; ++i) {
			vindex var;
			size_t val;
			in >> var >> val;
			m_evidence[var] = val;
		}

		return true;
	} catch (const std::runtime_error& e) {
		std::cerr << e.what() << std::endl;
		return false;
	}
}